

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::dotR(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  Cell CVar5;
  uint uVar6;
  
  requireDStackDepth(this,2,".R");
  this_00 = &this->dStack;
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  uVar4 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (this->writeToTarget == ToStdCout) {
    CVar5 = dataSpaceAtCell(this,this->VarOffsetNumericBase);
    lVar1 = std::cout;
    if (CVar5 == 8) {
      uVar6 = 0x40;
    }
    else if (CVar5 == 10) {
      uVar6 = 2;
    }
    else {
      uVar6 = (uint)(CVar5 == 0x10) << 3;
    }
    *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffffb5 | uVar6;
    *(long *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) =
         (long)(int)uVar3;
    std::ostream::operator<<((ostream *)&std::cout,uVar4);
    std::ostream::flush();
    return;
  }
  if (this->writeToTarget == ToString) {
    CVar5 = dataSpaceAtCell(this,this->VarOffsetNumericBase);
    lVar1 = *(long *)&this->field_0x20;
    lVar2 = *(long *)(lVar1 + -0x18);
    if (CVar5 == 8) {
      uVar6 = 0x40;
    }
    else if (CVar5 == 10) {
      uVar6 = 2;
    }
    else {
      uVar6 = (uint)(CVar5 == 0x10) << 3;
    }
    *(uint *)(&this->field_0x38 + lVar2) = *(uint *)(&this->field_0x38 + lVar2) & 0xffffffb5 | uVar6
    ;
    *(long *)(&this->field_0x30 + *(long *)(lVar1 + -0x18)) = (long)(int)uVar3;
    std::ostream::operator<<((ostream *)&this->field_0x20,uVar4);
    return;
  }
  return;
}

Assistant:

void dotR() {
			REQUIRE_DSTACK_DEPTH(2, ".R");
			auto width = static_cast<int>(dStack.getTop()); pop();
			auto n = static_cast<SCell>(dStack.getTop()); pop();
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << SETBASE() << std::setw(width) << n;
				break;
			case ToStdCout:
				std::cout << SETBASE() << std::setw(width) << n;
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}